

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::getRelativeJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex refFrameIndex,FrameIndex frameIndex,
          MatrixDynSize *outJacobian)

{
  bool bVar1;
  ulong in_RCX;
  MatrixStorageOrdering *in_RDX;
  MatrixView<double> *in_stack_000004f0;
  FrameIndex in_stack_000004f8;
  FrameIndex in_stack_00000500;
  KinDynComputations *in_stack_00000508;
  uint in_stack_ffffffffffffffa8;
  MatrixView<double> *in_stack_ffffffffffffffb0;
  
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize(in_RCX,6);
  MatrixView<double>::MatrixView<iDynTree::MatrixDynSize,_0>
            (in_stack_ffffffffffffffb0,(MatrixDynSize *)(ulong)in_stack_ffffffffffffffa8,in_RDX);
  bVar1 = getRelativeJacobianSparsityPattern
                    (in_stack_00000508,in_stack_00000500,in_stack_000004f8,in_stack_000004f0);
  return bVar1;
}

Assistant:

bool KinDynComputations::getRelativeJacobianSparsityPattern(const iDynTree::FrameIndex refFrameIndex,
                                                            const iDynTree::FrameIndex frameIndex,
                                                            iDynTree::MatrixDynSize & outJacobian) const
    {
        //I have the two links. Create the jacobian
        outJacobian.resize(6, pimpl->m_robot_model.getNrOfDOFs());

        return this->getRelativeJacobianSparsityPattern(refFrameIndex, frameIndex, MatrixView<double>(outJacobian));
    }